

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sort.h
# Opt level: O0

void Glucose::selectionSort<unsigned_int,Glucose::reduceDBAct_lt>
               (uint *array,int size,reduceDBAct_lt lt)

{
  undefined4 uVar1;
  CRef CVar2;
  bool bVar3;
  int in_ESI;
  long in_RDI;
  uint tmp;
  int best_i;
  int j;
  int i;
  CRef y;
  CRef x;
  CRef CVar4;
  
  for (CVar4 = 0; CVar2 = CVar4, x = CVar4, (int)CVar4 < in_ESI + -1; CVar4 = CVar4 + 1) {
    while (y = CVar2, x = x + 1, (int)x < in_ESI) {
      bVar3 = reduceDBAct_lt::operator()((reduceDBAct_lt *)CONCAT44(in_ESI,CVar4),x,y);
      CVar2 = x;
      if (!bVar3) {
        CVar2 = y;
      }
    }
    uVar1 = *(undefined4 *)(in_RDI + (long)(int)CVar4 * 4);
    *(undefined4 *)(in_RDI + (long)(int)CVar4 * 4) = *(undefined4 *)(in_RDI + (long)(int)y * 4);
    *(undefined4 *)(in_RDI + (long)(int)y * 4) = uVar1;
  }
  return;
}

Assistant:

void selectionSort(T* array, int size, LessThan lt)
{
    int     i, j, best_i;
    T       tmp;

    for (i = 0; i < size-1; i++){
        best_i = i;
        for (j = i+1; j < size; j++){
            if (lt(array[j], array[best_i]))
                best_i = j;
        }
        tmp = array[i]; array[i] = array[best_i]; array[best_i] = tmp;
    }
}